

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool __thiscall MeCab::Viterbi::viterbi<true,true>(Viterbi *this,Lattice *lattice)

{
  bool bVar1;
  undefined8 *puVar2;
  Node **ppNVar3;
  mecab_node_t *pmVar4;
  char *pcVar5;
  Tokenizer<mecab_node_t,_mecab_path_t> *allocator_00;
  mecab_node_t *pmVar6;
  Connector *connector;
  long lVar7;
  long *in_RSI;
  long in_RDI;
  long pos_1;
  Node *eos_node;
  Node *right_node;
  size_t pos;
  Node *bos_node;
  char *end;
  char *begin;
  size_t len;
  Allocator<mecab_node_t,_mecab_path_t> *allocator;
  Node **begin_node_list;
  Node **end_node_list;
  Lattice *in_stack_00000108;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_00000110;
  char *in_stack_00000118;
  char *in_stack_00000120;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_00000128;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff08;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff10;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff18;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff20;
  Allocator<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff40;
  Connector *in_stack_ffffffffffffff48;
  Node **in_stack_ffffffffffffff50;
  mecab_node_t *end_node_list_00;
  Node **in_stack_ffffffffffffff58;
  Node **begin_node_list_00;
  Node *in_stack_ffffffffffffff60;
  mecab_node_t *in_stack_ffffffffffffff68;
  Node *local_70;
  Node *local_58;
  
  puVar2 = (undefined8 *)(**(code **)(*in_RSI + 0x28))();
  ppNVar3 = (Node **)(**(code **)(*in_RSI + 0x20))();
  (**(code **)(*in_RSI + 0xb0))();
  local_70 = (Node *)(**(code **)(*in_RSI + 0x58))();
  (**(code **)(*in_RSI + 0x40))();
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
            ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 8));
  (**(code **)(*in_RSI + 0xb0))();
  pmVar4 = Tokenizer<mecab_node_t,_mecab_path_t>::getBOSNode
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pcVar5 = (char *)(**(code **)(*in_RSI + 0x40))();
  pmVar4->surface = pcVar5;
  *puVar2 = pmVar4;
  for (local_58 = (Node *)0x0; local_58 < local_70; local_58 = (Node *)((long)&local_58->prev + 1))
  {
    if (puVar2[(long)local_58] != 0) {
      scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)(in_RDI + 8));
      in_stack_ffffffffffffff68 =
           Tokenizer<mecab_node_t,_mecab_path_t>::lookup<true>
                     (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
                      in_stack_00000108);
      ppNVar3[(long)local_58] = in_stack_ffffffffffffff68;
      in_stack_ffffffffffffff60 = local_58;
      scoped_ptr<MeCab::Connector>::get((scoped_ptr<MeCab::Connector> *)(in_RDI + 0x18));
      bVar1 = anon_unknown_14::connect<true>
                        ((size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (!bVar1) {
        (**(code **)(*in_RSI + 0x128))(in_RSI,"too long sentence.");
        return false;
      }
    }
  }
  allocator_00 = scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                           ((scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *)
                            (in_RDI + 8));
  (**(code **)(*in_RSI + 0xb0))();
  pmVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::getEOSNode
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  connector = (Connector *)(**(code **)(*in_RSI + 0x40))();
  lVar7 = (**(code **)(*in_RSI + 0x58))();
  pmVar6->surface = (char *)((long)&connector->_vptr_Connector + lVar7);
  end_node_list_00 = pmVar6;
  begin_node_list_00 = ppNVar3;
  lVar7 = (**(code **)(*in_RSI + 0x58))();
  begin_node_list_00[lVar7] = end_node_list_00;
  do {
    if ((long)local_70 < 0) {
LAB_0015e5f1:
      *puVar2 = pmVar4;
      lVar7 = (**(code **)(*in_RSI + 0x58))();
      ppNVar3[lVar7] = pmVar6;
      return true;
    }
    if (puVar2[(long)local_70] != 0) {
      scoped_ptr<MeCab::Connector>::get((scoped_ptr<MeCab::Connector> *)(in_RDI + 0x18));
      bVar1 = anon_unknown_14::connect<true>
                        ((size_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         begin_node_list_00,&end_node_list_00->prev,connector,
                         (Allocator<mecab_node_t,_mecab_path_t> *)allocator_00);
      if (!bVar1) {
        (**(code **)(*in_RSI + 0x128))(in_RSI,"too long sentence.");
        return false;
      }
      goto LAB_0015e5f1;
    }
    local_70 = (Node *)((long)&local_70[-1].cost + 7);
  } while( true );
}

Assistant:

bool Viterbi::viterbi(Lattice *lattice) const {
  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();
  Allocator<Node, Path> *allocator = lattice->allocator();
  const size_t len = lattice->size();
  const char *begin = lattice->sentence();
  const char *end = begin + len;

  Node *bos_node = tokenizer_->getBOSNode(lattice->allocator());
  bos_node->surface = lattice->sentence();
  end_node_list[0] = bos_node;

  for (size_t pos = 0; pos < len; ++pos) {
    if (end_node_list[pos]) {
      Node *right_node = tokenizer_->lookup<IsPartial>(begin + pos, end,
                                                       allocator, lattice);
      begin_node_list[pos] = right_node;
      if (!connect<IsAllPath>(pos, right_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
}
}

  Node *eos_node = tokenizer_->getEOSNode(lattice->allocator());
  eos_node->surface = lattice->sentence() + lattice->size();
  begin_node_list[lattice->size()] = eos_node;

  for (long pos = len; static_cast<long>(pos) >= 0; --pos) {
    if (end_node_list[pos]) {
      if (!connect<IsAllPath>(pos, eos_node,
                              begin_node_list,
                              end_node_list,
                              connector_.get(),
                              allocator)) {
        lattice->set_what("too long sentence.");
        return false;
      }
      break;
    }
  }

  end_node_list[0] = bos_node;
  begin_node_list[lattice->size()] = eos_node;

  return true;
}